

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O0

int4 __thiscall EmitXml::beginBlock(EmitXml *this,FlowBlock *bl)

{
  int4 iVar1;
  ostream *poVar2;
  void *this_00;
  FlowBlock *bl_local;
  EmitXml *this_local;
  
  poVar2 = std::operator<<(this->s,"<block ");
  poVar2 = std::operator<<(poVar2,highlight[8]);
  poVar2 = std::operator<<(poVar2," blockref=\"0x");
  this_00 = (void *)std::ostream::operator<<(poVar2,std::hex);
  iVar1 = FlowBlock::getIndex(bl);
  poVar2 = (ostream *)std::ostream::operator<<(this_00,iVar1);
  std::operator<<(poVar2,"\">");
  return 0;
}

Assistant:

int4 EmitXml::beginBlock(const FlowBlock *bl) {
  *s << "<block " << highlight[(int4)no_color] << " blockref=\"0x" << hex <<
    bl->getIndex() << "\">";
  return 0;
}